

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_as_json_stack_overflow(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  ssize_t sVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  undefined8 uVar9;
  ulong __n;
  void *__s2;
  undefined8 extraout_RAX;
  undefined8 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  int *unaff_R12;
  char *pcVar13;
  uint uVar14;
  char *pcVar15;
  uint *__seed;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  long lVar21;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar45;
  undefined1 auVar40 [16];
  int iVar46;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  int iVar107;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  int iVar108;
  int iVar120;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar121 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  bson_t b;
  undefined1 auStack_123c [12];
  ulong uStack_1230;
  char *pcStack_1228;
  char *pcStack_1220;
  char *pcStack_1218;
  uint *puStack_1210;
  code *pcStack_1208;
  char acStack_1200 [32];
  char acStack_11e0 [32];
  undefined8 *puStack_11c0;
  char *pcStack_11b8;
  int iStack_11ac;
  void *pvStack_11a8;
  void *pvStack_11a0;
  char *pcStack_1198;
  long lStack_1190;
  uint uStack_1184;
  undefined1 auStack_1180 [16];
  undefined1 auStack_1170 [16];
  undefined1 auStack_1160 [16];
  undefined1 auStack_1150 [16];
  undefined1 auStack_1140 [16];
  undefined1 auStack_1130 [16];
  undefined1 auStack_1120 [16];
  undefined1 auStack_1110 [16];
  undefined1 auStack_10b8 [648];
  long lStack_e30;
  int *piStack_e28;
  code *apcStack_e08 [16];
  int iStack_d84;
  int aiStack_d80 [52];
  undefined1 auStack_cb0 [648];
  char *pcStack_a28;
  code *apcStack_a08 [16];
  long alStack_988 [47];
  char *pcStack_810;
  code *apcStack_808 [16];
  long alStack_788 [47];
  void *pvStack_610;
  code *pcStack_608;
  undefined1 auStack_600 [368];
  void *pvStack_490;
  code *pcStack_488;
  undefined1 auStack_480 [368];
  void *pvStack_310;
  code *pcStack_308;
  undefined1 auStack_300 [368];
  void *pvStack_190;
  code *pcStack_188;
  undefined1 auStack_180 [360];
  
  pcStack_188 = (code *)0x12da50;
  pvVar4 = (void *)bson_malloc0(0x1100000);
  pcStack_188 = (code *)0x12da63;
  iVar2 = open("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/stackoverflow.bson"
               ,0);
  if (iVar2 == -1) {
    pcStack_188 = (code *)0x12dadf;
    test_bson_as_json_stack_overflow_cold_5();
LAB_0012dadf:
    pcStack_188 = (code *)0x12dae4;
    test_bson_as_json_stack_overflow_cold_1();
LAB_0012dae4:
    pcStack_188 = (code *)0x12dae9;
    test_bson_as_json_stack_overflow_cold_2();
LAB_0012dae9:
    pcStack_188 = (code *)0x12daee;
    test_bson_as_json_stack_overflow_cold_4();
  }
  else {
    pcStack_188 = (code *)0x12da77;
    sVar5 = read(iVar2,pvVar4,0x1100000);
    if (sVar5 != 0x1000004) goto LAB_0012dadf;
    pcStack_188 = (code *)0x12da8f;
    cVar1 = bson_init_static(auStack_180,pvVar4,0x1000004);
    if (cVar1 == '\0') goto LAB_0012dae4;
    pcStack_188 = (code *)0x12da9d;
    pcVar6 = (char *)bson_as_json(auStack_180);
    if (pcVar6 == (char *)0x0) goto LAB_0012dae9;
    pcStack_188 = (code *)0x12dab4;
    pcVar7 = strstr(pcVar6,"...");
    if (pcVar7 != (char *)0x0) {
      pcStack_188 = (code *)0x12dac1;
      bson_free(pcVar6);
      pcStack_188 = (code *)0x12dac9;
      bson_destroy(auStack_180);
      pcStack_188 = (code *)0x12dad1;
      bson_free(pvVar4);
      return;
    }
  }
  pcStack_188 = test_bson_corrupt;
  test_bson_as_json_stack_overflow_cold_3();
  pcStack_308 = (code *)0x12db0d;
  pvStack_190 = pvVar4;
  pcStack_188 = (code *)&stack0xfffffffffffffff8;
  pvVar4 = (void *)bson_malloc0(0x400);
  pcStack_308 = (code *)0x12db20;
  iVar2 = open("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/test55.bson"
               ,0);
  if (iVar2 == -1) {
    pcStack_308 = (code *)0x12db79;
    test_bson_corrupt_cold_4();
LAB_0012db79:
    pcStack_308 = (code *)0x12db7e;
    test_bson_corrupt_cold_1();
LAB_0012db7e:
    pcStack_308 = (code *)0x12db83;
    test_bson_corrupt_cold_2();
  }
  else {
    pcStack_308 = (code *)0x12db34;
    sVar5 = read(iVar2,pvVar4,0x400);
    if (sVar5 != 0x18) goto LAB_0012db79;
    pcStack_308 = (code *)0x12db4a;
    cVar1 = bson_init_static(auStack_300,pvVar4,0x18);
    if (cVar1 == '\0') goto LAB_0012db7e;
    pcStack_308 = (code *)0x12db58;
    lVar8 = bson_as_json(auStack_300);
    if (lVar8 == 0) {
      pcStack_308 = (code *)0x12db65;
      bson_destroy(auStack_300);
      pcStack_308 = (code *)0x12db6d;
      bson_free(pvVar4);
      return;
    }
  }
  pcStack_308 = test_bson_corrupt_utf8;
  test_bson_corrupt_cold_3();
  pcStack_488 = (code *)0x12dba2;
  pvStack_310 = pvVar4;
  pcStack_308 = (code *)&pcStack_188;
  pvVar4 = (void *)bson_malloc0(0x400);
  pcStack_488 = (code *)0x12dbb5;
  iVar2 = open("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/test56.bson"
               ,0);
  if (iVar2 == -1) {
    pcStack_488 = (code *)0x12dc0e;
    test_bson_corrupt_utf8_cold_4();
LAB_0012dc0e:
    pcStack_488 = (code *)0x12dc13;
    test_bson_corrupt_utf8_cold_1();
LAB_0012dc13:
    pcStack_488 = (code *)0x12dc18;
    test_bson_corrupt_utf8_cold_2();
  }
  else {
    pcStack_488 = (code *)0x12dbc9;
    sVar5 = read(iVar2,pvVar4,0x400);
    if (sVar5 != 0x2a) goto LAB_0012dc0e;
    pcStack_488 = (code *)0x12dbdf;
    cVar1 = bson_init_static(auStack_480,pvVar4,0x2a);
    if (cVar1 == '\0') goto LAB_0012dc13;
    pcStack_488 = (code *)0x12dbed;
    lVar8 = bson_as_json(auStack_480);
    if (lVar8 == 0) {
      pcStack_488 = (code *)0x12dbfa;
      bson_destroy(auStack_480);
      pcStack_488 = (code *)0x12dc02;
      bson_free(pvVar4);
      return;
    }
  }
  pcStack_488 = test_bson_corrupt_binary;
  test_bson_corrupt_utf8_cold_3();
  pcStack_608 = (code *)0x12dc37;
  pvStack_490 = pvVar4;
  pcStack_488 = (code *)&pcStack_308;
  pvVar4 = (void *)bson_malloc0(0x400);
  pcStack_608 = (code *)0x12dc4a;
  iVar2 = open("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/test57.bson"
               ,0);
  if (iVar2 == -1) {
    pcStack_608 = (code *)0x12dca3;
    test_bson_corrupt_binary_cold_4();
LAB_0012dca3:
    pcStack_608 = (code *)0x12dca8;
    test_bson_corrupt_binary_cold_1();
LAB_0012dca8:
    pcStack_608 = (code *)0x12dcad;
    test_bson_corrupt_binary_cold_2();
  }
  else {
    pcStack_608 = (code *)0x12dc5e;
    sVar5 = read(iVar2,pvVar4,0x400);
    if (sVar5 != 0x1a) goto LAB_0012dca3;
    pcStack_608 = (code *)0x12dc74;
    cVar1 = bson_init_static(auStack_600,pvVar4,0x1a);
    if (cVar1 == '\0') goto LAB_0012dca8;
    pcStack_608 = (code *)0x12dc82;
    lVar8 = bson_as_json(auStack_600,0);
    if (lVar8 == 0) {
      pcStack_608 = (code *)0x12dc8f;
      bson_destroy(auStack_600);
      pcStack_608 = (code *)0x12dc97;
      bson_free(pvVar4);
      return;
    }
  }
  pcStack_608 = test_bson_as_json_spacing;
  test_bson_corrupt_binary_cold_3();
  alStack_788[0xf] = 0;
  alStack_788[0x10] = 0;
  alStack_788[0xd] = 0;
  alStack_788[0xe] = 0;
  alStack_788[0xb] = 0;
  alStack_788[0xc] = 0;
  alStack_788[9] = 0;
  alStack_788[10] = 0;
  alStack_788[7] = 0;
  alStack_788[8] = 0;
  alStack_788[5] = 0;
  alStack_788[6] = 0;
  alStack_788[3] = 0;
  alStack_788[4] = 0;
  alStack_788[1] = 0x500000003;
  alStack_788[2] = 5;
  apcStack_808[0] = (code *)0x12dd07;
  pvStack_610 = pvVar4;
  pcStack_608 = (code *)&pcStack_488;
  pcVar6 = (char *)bson_as_json(alStack_788 + 1,alStack_788);
  apcStack_808[0] = (code *)0x12dd19;
  iVar2 = strcmp(pcVar6,"{ }");
  if (iVar2 == 0) {
    if (alStack_788[0] != 3) goto LAB_0012dd9a;
    apcStack_808[0] = (code *)0x12dd2d;
    bson_free(pcVar6);
    apcStack_808[0] = (code *)0x12dd4e;
    bson_append_int32(alStack_788 + 1,"a",1,1);
    apcStack_808[0] = (code *)0x12dd5b;
    pcVar6 = (char *)bson_as_json(alStack_788 + 1,alStack_788);
    apcStack_808[0] = (code *)0x12dd6d;
    iVar2 = strcmp(pcVar6,"{ \"a\" : 1 }");
    if (iVar2 != 0) goto LAB_0012dd9f;
    if (alStack_788[0] == 0xb) {
      apcStack_808[0] = (code *)0x12dd81;
      bson_free(pcVar6);
      apcStack_808[0] = (code *)0x12dd8e;
      bson_destroy(alStack_788 + 1);
      return;
    }
  }
  else {
    apcStack_808[0] = (code *)0x12dd9a;
    test_bson_as_json_spacing_cold_1();
LAB_0012dd9a:
    apcStack_808[0] = (code *)0x12dd9f;
    test_bson_as_json_spacing_cold_2();
LAB_0012dd9f:
    apcStack_808[0] = (code *)0x12dda4;
    test_bson_as_json_spacing_cold_3();
  }
  apcStack_808[0] = test_bson_array_as_json;
  test_bson_as_json_spacing_cold_4();
  alStack_988[0xf] = 0;
  alStack_988[0x10] = 0;
  alStack_988[0xd] = 0;
  alStack_988[0xe] = 0;
  alStack_988[0xb] = 0;
  alStack_988[0xc] = 0;
  alStack_988[9] = 0;
  alStack_988[10] = 0;
  alStack_988[7] = 0;
  alStack_988[8] = 0;
  alStack_988[5] = 0;
  alStack_988[6] = 0;
  alStack_988[3] = 0;
  alStack_988[4] = 0;
  alStack_988[1] = 0x500000003;
  alStack_988[2] = 5;
  apcStack_a08[0] = (code *)0x12ddfe;
  pcStack_810 = pcVar6;
  apcStack_808[0] = (code *)&pcStack_608;
  pcVar6 = (char *)bson_array_as_json(alStack_988 + 1,alStack_988);
  apcStack_a08[0] = (code *)0x12de10;
  iVar2 = strcmp(pcVar6,"[ ]");
  if (iVar2 == 0) {
    if (alStack_988[0] != 3) goto LAB_0012de91;
    apcStack_a08[0] = (code *)0x12de24;
    bson_free(pcVar6);
    apcStack_a08[0] = (code *)0x12de45;
    bson_append_int32(alStack_988 + 1,"0",1,1);
    apcStack_a08[0] = (code *)0x12de52;
    pcVar6 = (char *)bson_array_as_json(alStack_988 + 1,alStack_988);
    apcStack_a08[0] = (code *)0x12de64;
    iVar2 = strcmp(pcVar6,"[ 1 ]");
    if (iVar2 != 0) goto LAB_0012de96;
    if (alStack_988[0] == 5) {
      apcStack_a08[0] = (code *)0x12de78;
      bson_free(pcVar6);
      apcStack_a08[0] = (code *)0x12de85;
      bson_destroy(alStack_988 + 1);
      return;
    }
  }
  else {
    apcStack_a08[0] = (code *)0x12de91;
    test_bson_array_as_json_cold_1();
LAB_0012de91:
    apcStack_a08[0] = (code *)0x12de96;
    test_bson_array_as_json_cold_2();
LAB_0012de96:
    apcStack_a08[0] = (code *)0x12de9b;
    test_bson_array_as_json_cold_3();
  }
  apcStack_a08[0] = test_bson_json_allow_multiple;
  test_bson_array_as_json_cold_4();
  aiStack_d80[0x1c] = 0;
  aiStack_d80[0x1d] = 0;
  aiStack_d80[0x1e] = 0;
  aiStack_d80[0x1f] = 0;
  aiStack_d80[0x18] = 0;
  aiStack_d80[0x19] = 0;
  aiStack_d80[0x1a] = 0;
  aiStack_d80[0x1b] = 0;
  aiStack_d80[0x14] = 0;
  aiStack_d80[0x15] = 0;
  aiStack_d80[0x16] = 0;
  aiStack_d80[0x17] = 0;
  aiStack_d80[0x10] = 0;
  aiStack_d80[0x11] = 0;
  aiStack_d80[0x12] = 0;
  aiStack_d80[0x13] = 0;
  aiStack_d80[0xc] = 0;
  aiStack_d80[0xd] = 0;
  aiStack_d80[0xe] = 0;
  aiStack_d80[0xf] = 0;
  aiStack_d80[8] = 0;
  aiStack_d80[9] = 0;
  aiStack_d80[10] = 0;
  aiStack_d80[0xb] = 0;
  aiStack_d80[4] = 0;
  aiStack_d80[5] = 0;
  aiStack_d80[6] = 0;
  aiStack_d80[7] = 0;
  aiStack_d80[0] = 3;
  aiStack_d80[1] = 5;
  aiStack_d80[2] = 5;
  aiStack_d80[3] = 0;
  pcVar7 = "{\"a\": 1}{\"b\": 1}";
  apcStack_e08[0] = (code *)0x12df33;
  pcStack_a28 = pcVar6;
  apcStack_a08[0] = (code *)apcStack_808;
  lVar8 = bson_json_reader_new("{\"a\": 1}{\"b\": 1}",test_bson_json_read_cb_helper,0,0,0);
  apcStack_e08[0] = (code *)0x12df4b;
  pcVar6 = (char *)bson_json_reader_new("{\"a\": 1}{\"b\": 1}",test_bson_json_read_cb_helper,0,1,0);
  if (lVar8 == 0) {
    apcStack_e08[0] = (code *)0x12e1d8;
    test_bson_json_allow_multiple_cold_14();
LAB_0012e1d8:
    apcStack_e08[0] = (code *)0x12e1dd;
    test_bson_json_allow_multiple_cold_13();
LAB_0012e1dd:
    apcStack_e08[0] = (code *)0x12e1f5;
    test_bson_json_allow_multiple_cold_1();
LAB_0012e1f5:
    apcStack_e08[0] = (code *)0x12e1fa;
    test_bson_json_allow_multiple_cold_2();
LAB_0012e1fa:
    apcStack_e08[0] = (code *)0x12e212;
    test_bson_json_allow_multiple_cold_3();
LAB_0012e212:
    apcStack_e08[0] = (code *)0x12e217;
    test_bson_json_allow_multiple_cold_4();
LAB_0012e217:
    apcStack_e08[0] = (code *)0x12e22f;
    test_bson_json_allow_multiple_cold_5();
LAB_0012e22f:
    apcStack_e08[0] = (code *)0x12e234;
    test_bson_json_allow_multiple_cold_6();
LAB_0012e234:
    apcStack_e08[0] = (code *)0x12e24c;
    test_bson_json_allow_multiple_cold_7();
LAB_0012e24c:
    apcStack_e08[0] = (code *)0x12e251;
    test_bson_json_allow_multiple_cold_8();
LAB_0012e251:
    apcStack_e08[0] = (code *)0x12e269;
    test_bson_json_allow_multiple_cold_9();
LAB_0012e269:
    apcStack_e08[0] = (code *)0x12e26e;
    test_bson_json_allow_multiple_cold_10();
  }
  else {
    pcVar7 = pcVar6;
    if (pcVar6 == (char *)0x0) goto LAB_0012e1d8;
    apcStack_e08[0] = (code *)0x12df78;
    iVar2 = bson_json_reader_read(lVar8,aiStack_d80,auStack_cb0);
    if (iVar2 != 1) goto LAB_0012e1dd;
    apcStack_e08[0] = (code *)0x12df86;
    uVar9 = bson_bcone_magic();
    unaff_R12 = &iStack_d84;
    apcStack_e08[0] = (code *)0x12dfb2;
    bcon_extract(aiStack_d80,"a",uVar9,0xf,unaff_R12,0);
    if (iStack_d84 != 1) goto LAB_0012e1f5;
    unaff_R12 = aiStack_d80;
    apcStack_e08[0] = (code *)0x12dfcf;
    bson_reinit(unaff_R12);
    apcStack_e08[0] = (code *)0x12dfe2;
    iVar2 = bson_json_reader_read(lVar8,unaff_R12,auStack_cb0);
    if (iVar2 != 1) goto LAB_0012e1fa;
    unaff_R12 = &iStack_d84;
    apcStack_e08[0] = (code *)0x12e014;
    bcon_extract(aiStack_d80,"b",uVar9,0xf,unaff_R12,0);
    if (iStack_d84 != 1) goto LAB_0012e212;
    unaff_R12 = aiStack_d80;
    apcStack_e08[0] = (code *)0x12e031;
    bson_reinit(unaff_R12);
    apcStack_e08[0] = (code *)0x12e044;
    iVar2 = bson_json_reader_read(lVar8,unaff_R12,auStack_cb0);
    if (iVar2 != 1) goto LAB_0012e217;
    unaff_R12 = &iStack_d84;
    apcStack_e08[0] = (code *)0x12e076;
    bcon_extract(aiStack_d80,"a",uVar9,0xf,unaff_R12,0);
    if (iStack_d84 != 1) goto LAB_0012e22f;
    unaff_R12 = aiStack_d80;
    apcStack_e08[0] = (code *)0x12e093;
    bson_reinit(unaff_R12);
    apcStack_e08[0] = (code *)0x12e0a6;
    iVar2 = bson_json_reader_read(pcVar6,unaff_R12,auStack_cb0);
    if (iVar2 != 1) goto LAB_0012e234;
    unaff_R12 = &iStack_d84;
    apcStack_e08[0] = (code *)0x12e0d8;
    bcon_extract(aiStack_d80,"a",uVar9,0xf,unaff_R12,0);
    if (iStack_d84 != 1) goto LAB_0012e24c;
    unaff_R12 = aiStack_d80;
    apcStack_e08[0] = (code *)0x12e0f5;
    bson_reinit(unaff_R12);
    apcStack_e08[0] = (code *)0x12e108;
    iVar2 = bson_json_reader_read(pcVar6,unaff_R12,auStack_cb0);
    if (iVar2 != 1) goto LAB_0012e251;
    unaff_R12 = &iStack_d84;
    apcStack_e08[0] = (code *)0x12e13a;
    bcon_extract(aiStack_d80,"b",uVar9,0xf,unaff_R12,0);
    if (iStack_d84 != 1) goto LAB_0012e269;
    unaff_R12 = aiStack_d80;
    apcStack_e08[0] = (code *)0x12e157;
    bson_reinit(unaff_R12);
    apcStack_e08[0] = (code *)0x12e16a;
    iVar2 = bson_json_reader_read(pcVar6,unaff_R12,auStack_cb0);
    if (iVar2 == 1) {
      unaff_R12 = &iStack_d84;
      apcStack_e08[0] = (code *)0x12e19c;
      bcon_extract(aiStack_d80,"a",uVar9,0xf,unaff_R12,0);
      if (iStack_d84 == 1) {
        apcStack_e08[0] = (code *)0x12e1b1;
        bson_json_reader_destroy(lVar8);
        apcStack_e08[0] = (code *)0x12e1b9;
        bson_json_reader_destroy(pcVar6);
        apcStack_e08[0] = (code *)0x12e1c6;
        bson_destroy(aiStack_d80);
        return;
      }
      goto LAB_0012e286;
    }
  }
  apcStack_e08[0] = (code *)0x12e286;
  test_bson_json_allow_multiple_cold_11();
LAB_0012e286:
  apcStack_e08[0] = test_bson_json_read_buffering;
  test_bson_json_allow_multiple_cold_12();
  auStack_1110 = (undefined1  [16])0x0;
  auStack_1120 = (undefined1  [16])0x0;
  auStack_1130 = (undefined1  [16])0x0;
  auStack_1140 = (undefined1  [16])0x0;
  auStack_1150 = (undefined1  [16])0x0;
  auStack_1160 = (undefined1  [16])0x0;
  auStack_1170 = (undefined1  [16])0x0;
  auStack_1180[8] = 5;
  auStack_1180._0_8_ = 0x500000003;
  auStack_1180._9_7_ = 0;
  __seed = &uStack_1184;
  uStack_1184 = 0x2a;
  pcStack_1208 = (code *)0x12e2fa;
  lStack_e30 = lVar8;
  piStack_e28 = unaff_R12;
  apcStack_e08[0] = (code *)apcStack_a08;
  puStack_11c0 = (undefined8 *)bson_string_new(0);
  pcVar6 = (char *)0x1;
LAB_0012e305:
  lStack_1190 = (long)pcVar6 * 8;
  iVar2 = 0;
  pcStack_1198 = pcVar6;
LAB_0012e319:
  pcStack_1208 = (code *)0x12e322;
  iStack_11ac = iVar2;
  __n = bson_malloc(lStack_1190);
  pcVar13 = (char *)0x0;
  do {
    pcStack_1208 = (code *)0x12e32d;
    uVar9 = bson_new();
    *(undefined8 *)(__n + (long)pcVar13 * 8) = uVar9;
    pcStack_1208 = (code *)0x12e339;
    iVar2 = rand_r(__seed);
    pcStack_11b8 = (char *)(ulong)(uint)(iVar2 % 5);
    if (0 < iVar2 % 5) {
      pcVar7 = (char *)0x0;
      do {
        uVar9 = *(undefined8 *)(__n + (long)pcVar13 * 8);
        pcStack_1208 = (code *)0x12e371;
        iVar2 = rand_r(__seed);
        lVar8 = (long)iVar2 + ((ulong)(long)iVar2 / 3 & 0xfffffffffffffff8) * -3;
        if (lVar8 != 0) {
          lVar21 = lVar8 + -1;
          auVar16._8_4_ = (int)lVar21;
          auVar16._0_8_ = lVar21;
          auVar16._12_4_ = (int)((ulong)lVar21 >> 0x20);
          uVar12 = 0;
          auVar42 = _DAT_00147390;
          auVar58 = _DAT_00147380;
          auVar126 = _DAT_00147370;
          auVar92 = _DAT_00147360;
          auVar28 = _DAT_00147350;
          auVar31 = _DAT_00147340;
          auVar34 = _DAT_00147330;
          auVar37 = _DAT_00147320;
          do {
            auVar40 = auVar16 ^ _DAT_001473a0;
            auVar47 = auVar42 ^ _DAT_001473a0;
            iVar2 = auVar40._0_4_;
            iVar108 = -(uint)(iVar2 < auVar47._0_4_);
            iVar107 = auVar40._4_4_;
            auVar48._4_4_ = -(uint)(iVar107 < auVar47._4_4_);
            iVar45 = auVar40._8_4_;
            iVar120 = -(uint)(iVar45 < auVar47._8_4_);
            iVar46 = auVar40._12_4_;
            auVar48._12_4_ = -(uint)(iVar46 < auVar47._12_4_);
            auVar83._4_4_ = iVar108;
            auVar83._0_4_ = iVar108;
            auVar83._8_4_ = iVar120;
            auVar83._12_4_ = iVar120;
            auVar121 = pshuflw(in_XMM13,auVar83,0xe8);
            auVar40._4_4_ = -(uint)(auVar47._4_4_ == iVar107);
            auVar40._12_4_ = -(uint)(auVar47._12_4_ == iVar46);
            auVar40._0_4_ = auVar40._4_4_;
            auVar40._8_4_ = auVar40._12_4_;
            auVar122 = pshuflw(in_XMM14,auVar40,0xe8);
            auVar48._0_4_ = auVar48._4_4_;
            auVar48._8_4_ = auVar48._12_4_;
            auVar47 = pshuflw(auVar121,auVar48,0xe8);
            auVar123._8_4_ = 0xffffffff;
            auVar123._0_8_ = 0xffffffffffffffff;
            auVar123._12_4_ = 0xffffffff;
            auVar47 = (auVar47 | auVar122 & auVar121) ^ auVar123;
            auVar47 = packssdw(auVar47,auVar47);
            cVar1 = (char)uVar12;
            if ((auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              acStack_1200[uVar12] = cVar1 + 'a';
            }
            auVar48 = auVar40 & auVar83 | auVar48;
            auVar40 = packssdw(auVar48,auVar48);
            auVar40 = packssdw(auVar40 ^ auVar123,auVar40 ^ auVar123);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40._0_4_ >> 8 & 1) != 0) {
              acStack_1200[uVar12 + 1] = cVar1 + 'b';
            }
            auVar40 = auVar58 ^ _DAT_001473a0;
            iVar108 = -(uint)(iVar2 < auVar40._0_4_);
            auVar122._4_4_ = -(uint)(iVar107 < auVar40._4_4_);
            iVar120 = -(uint)(iVar45 < auVar40._8_4_);
            auVar122._12_4_ = -(uint)(iVar46 < auVar40._12_4_);
            auVar47._4_4_ = iVar108;
            auVar47._0_4_ = iVar108;
            auVar47._8_4_ = iVar120;
            auVar47._12_4_ = iVar120;
            auVar121._4_4_ = -(uint)(auVar40._4_4_ == iVar107);
            auVar121._12_4_ = -(uint)(auVar40._12_4_ == iVar46);
            auVar121._0_4_ = auVar121._4_4_;
            auVar121._8_4_ = auVar121._12_4_;
            auVar122._0_4_ = auVar122._4_4_;
            auVar122._8_4_ = auVar122._12_4_;
            auVar40 = auVar121 & auVar47 | auVar122;
            auVar40 = packssdw(auVar40,auVar40);
            auVar40 = packssdw(auVar40 ^ auVar123,auVar40 ^ auVar123);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40._0_4_ >> 0x10 & 1) != 0) {
              acStack_1200[uVar12 + 2] = cVar1 + 'c';
            }
            auVar47 = pshufhw(auVar47,auVar47,0x84);
            auVar83 = pshufhw(auVar121,auVar121,0x84);
            auVar48 = pshufhw(auVar47,auVar122,0x84);
            auVar47 = (auVar48 | auVar83 & auVar47) ^ auVar123;
            auVar47 = packssdw(auVar47,auVar47);
            auVar47 = packsswb(auVar47,auVar47);
            if ((auVar47._0_4_ >> 0x18 & 1) != 0) {
              acStack_1200[uVar12 + 3] = cVar1 + 'd';
            }
            auVar47 = auVar126 ^ _DAT_001473a0;
            iVar108 = -(uint)(iVar2 < auVar47._0_4_);
            auVar50._4_4_ = -(uint)(iVar107 < auVar47._4_4_);
            iVar120 = -(uint)(iVar45 < auVar47._8_4_);
            auVar50._12_4_ = -(uint)(iVar46 < auVar47._12_4_);
            auVar84._4_4_ = iVar108;
            auVar84._0_4_ = iVar108;
            auVar84._8_4_ = iVar120;
            auVar84._12_4_ = iVar120;
            auVar40 = pshuflw(auVar40,auVar84,0xe8);
            auVar49._4_4_ = -(uint)(auVar47._4_4_ == iVar107);
            auVar49._12_4_ = -(uint)(auVar47._12_4_ == iVar46);
            auVar49._0_4_ = auVar49._4_4_;
            auVar49._8_4_ = auVar49._12_4_;
            auVar48 = pshuflw(auVar123,auVar49,0xe8);
            auVar50._0_4_ = auVar50._4_4_;
            auVar50._8_4_ = auVar50._12_4_;
            auVar47 = pshuflw(auVar40,auVar50,0xe8);
            auVar124._8_4_ = 0xffffffff;
            auVar124._0_8_ = 0xffffffffffffffff;
            auVar124._12_4_ = 0xffffffff;
            auVar40 = (auVar47 | auVar48 & auVar40) ^ auVar124;
            auVar40 = packssdw(auVar40,auVar40);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              acStack_1200[uVar12 + 4] = cVar1 + 'e';
            }
            auVar50 = auVar49 & auVar84 | auVar50;
            auVar40 = packssdw(auVar50,auVar50);
            auVar40 = packssdw(auVar40 ^ auVar124,auVar40 ^ auVar124);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40._4_2_ >> 8 & 1) != 0) {
              acStack_1200[uVar12 + 5] = cVar1 + 'f';
            }
            auVar40 = auVar92 ^ _DAT_001473a0;
            iVar108 = -(uint)(iVar2 < auVar40._0_4_);
            auVar109._4_4_ = -(uint)(iVar107 < auVar40._4_4_);
            iVar120 = -(uint)(iVar45 < auVar40._8_4_);
            auVar109._12_4_ = -(uint)(iVar46 < auVar40._12_4_);
            auVar51._4_4_ = iVar108;
            auVar51._0_4_ = iVar108;
            auVar51._8_4_ = iVar120;
            auVar51._12_4_ = iVar120;
            auVar85._4_4_ = -(uint)(auVar40._4_4_ == iVar107);
            auVar85._12_4_ = -(uint)(auVar40._12_4_ == iVar46);
            auVar85._0_4_ = auVar85._4_4_;
            auVar85._8_4_ = auVar85._12_4_;
            auVar109._0_4_ = auVar109._4_4_;
            auVar109._8_4_ = auVar109._12_4_;
            auVar40 = auVar85 & auVar51 | auVar109;
            auVar40 = packssdw(auVar40,auVar40);
            auVar40 = packssdw(auVar40 ^ auVar124,auVar40 ^ auVar124);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              acStack_1200[uVar12 + 6] = cVar1 + 'g';
            }
            auVar47 = pshufhw(auVar51,auVar51,0x84);
            auVar83 = pshufhw(auVar85,auVar85,0x84);
            auVar48 = pshufhw(auVar47,auVar109,0x84);
            auVar47 = (auVar48 | auVar83 & auVar47) ^ auVar124;
            auVar47 = packssdw(auVar47,auVar47);
            auVar47 = packsswb(auVar47,auVar47);
            if ((auVar47._6_2_ >> 8 & 1) != 0) {
              acStack_1200[uVar12 + 7] = cVar1 + 'h';
            }
            auVar47 = auVar28 ^ _DAT_001473a0;
            iVar108 = -(uint)(iVar2 < auVar47._0_4_);
            auVar53._4_4_ = -(uint)(iVar107 < auVar47._4_4_);
            iVar120 = -(uint)(iVar45 < auVar47._8_4_);
            auVar53._12_4_ = -(uint)(iVar46 < auVar47._12_4_);
            auVar86._4_4_ = iVar108;
            auVar86._0_4_ = iVar108;
            auVar86._8_4_ = iVar120;
            auVar86._12_4_ = iVar120;
            auVar40 = pshuflw(auVar40,auVar86,0xe8);
            auVar52._4_4_ = -(uint)(auVar47._4_4_ == iVar107);
            auVar52._12_4_ = -(uint)(auVar47._12_4_ == iVar46);
            auVar52._0_4_ = auVar52._4_4_;
            auVar52._8_4_ = auVar52._12_4_;
            auVar48 = pshuflw(auVar124,auVar52,0xe8);
            auVar53._0_4_ = auVar53._4_4_;
            auVar53._8_4_ = auVar53._12_4_;
            auVar47 = pshuflw(auVar40,auVar53,0xe8);
            auVar125._8_4_ = 0xffffffff;
            auVar125._0_8_ = 0xffffffffffffffff;
            auVar125._12_4_ = 0xffffffff;
            auVar40 = (auVar47 | auVar48 & auVar40) ^ auVar125;
            auVar40 = packssdw(auVar40,auVar40);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              acStack_1200[uVar12 + 8] = cVar1 + 'i';
            }
            auVar53 = auVar52 & auVar86 | auVar53;
            auVar40 = packssdw(auVar53,auVar53);
            auVar40 = packssdw(auVar40 ^ auVar125,auVar40 ^ auVar125);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40._8_2_ >> 8 & 1) != 0) {
              acStack_1200[uVar12 + 9] = cVar1 + 'j';
            }
            auVar40 = auVar31 ^ _DAT_001473a0;
            iVar108 = -(uint)(iVar2 < auVar40._0_4_);
            auVar110._4_4_ = -(uint)(iVar107 < auVar40._4_4_);
            iVar120 = -(uint)(iVar45 < auVar40._8_4_);
            auVar110._12_4_ = -(uint)(iVar46 < auVar40._12_4_);
            auVar54._4_4_ = iVar108;
            auVar54._0_4_ = iVar108;
            auVar54._8_4_ = iVar120;
            auVar54._12_4_ = iVar120;
            auVar87._4_4_ = -(uint)(auVar40._4_4_ == iVar107);
            auVar87._12_4_ = -(uint)(auVar40._12_4_ == iVar46);
            auVar87._0_4_ = auVar87._4_4_;
            auVar87._8_4_ = auVar87._12_4_;
            auVar110._0_4_ = auVar110._4_4_;
            auVar110._8_4_ = auVar110._12_4_;
            auVar40 = auVar87 & auVar54 | auVar110;
            auVar40 = packssdw(auVar40,auVar40);
            auVar40 = packssdw(auVar40 ^ auVar125,auVar40 ^ auVar125);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              acStack_1200[uVar12 + 10] = cVar1 + 'k';
            }
            auVar47 = pshufhw(auVar54,auVar54,0x84);
            auVar83 = pshufhw(auVar87,auVar87,0x84);
            auVar48 = pshufhw(auVar47,auVar110,0x84);
            auVar47 = (auVar48 | auVar83 & auVar47) ^ auVar125;
            auVar47 = packssdw(auVar47,auVar47);
            auVar47 = packsswb(auVar47,auVar47);
            if ((auVar47._10_2_ >> 8 & 1) != 0) {
              acStack_1200[uVar12 + 0xb] = cVar1 + 'l';
            }
            auVar47 = auVar34 ^ _DAT_001473a0;
            iVar108 = -(uint)(iVar2 < auVar47._0_4_);
            auVar56._4_4_ = -(uint)(iVar107 < auVar47._4_4_);
            iVar120 = -(uint)(iVar45 < auVar47._8_4_);
            auVar56._12_4_ = -(uint)(iVar46 < auVar47._12_4_);
            auVar88._4_4_ = iVar108;
            auVar88._0_4_ = iVar108;
            auVar88._8_4_ = iVar120;
            auVar88._12_4_ = iVar120;
            auVar40 = pshuflw(auVar40,auVar88,0xe8);
            auVar55._4_4_ = -(uint)(auVar47._4_4_ == iVar107);
            auVar55._12_4_ = -(uint)(auVar47._12_4_ == iVar46);
            auVar55._0_4_ = auVar55._4_4_;
            auVar55._8_4_ = auVar55._12_4_;
            auVar48 = pshuflw(auVar125,auVar55,0xe8);
            auVar56._0_4_ = auVar56._4_4_;
            auVar56._8_4_ = auVar56._12_4_;
            auVar47 = pshuflw(auVar40,auVar56,0xe8);
            in_XMM14._8_4_ = 0xffffffff;
            in_XMM14._0_8_ = 0xffffffffffffffff;
            in_XMM14._12_4_ = 0xffffffff;
            auVar40 = (auVar47 | auVar48 & auVar40) ^ in_XMM14;
            auVar40 = packssdw(auVar40,auVar40);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              acStack_1200[uVar12 + 0xc] = cVar1 + 'm';
            }
            auVar56 = auVar55 & auVar88 | auVar56;
            auVar40 = packssdw(auVar56,auVar56);
            auVar40 = packssdw(auVar40 ^ in_XMM14,auVar40 ^ in_XMM14);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40._12_2_ >> 8 & 1) != 0) {
              acStack_1200[uVar12 + 0xd] = cVar1 + 'n';
            }
            auVar40 = auVar37 ^ _DAT_001473a0;
            auVar111._0_4_ = -(uint)(iVar2 < auVar40._0_4_);
            auVar111._4_4_ = -(uint)(iVar107 < auVar40._4_4_);
            auVar111._8_4_ = -(uint)(iVar45 < auVar40._8_4_);
            auVar111._12_4_ = -(uint)(iVar46 < auVar40._12_4_);
            auVar57._4_4_ = auVar111._0_4_;
            auVar57._0_4_ = auVar111._0_4_;
            auVar57._8_4_ = auVar111._8_4_;
            auVar57._12_4_ = auVar111._8_4_;
            iVar2 = -(uint)(auVar40._4_4_ == iVar107);
            iVar107 = -(uint)(auVar40._12_4_ == iVar46);
            auVar41._4_4_ = iVar2;
            auVar41._0_4_ = iVar2;
            auVar41._8_4_ = iVar107;
            auVar41._12_4_ = iVar107;
            auVar89._4_4_ = auVar111._4_4_;
            auVar89._0_4_ = auVar111._4_4_;
            auVar89._8_4_ = auVar111._12_4_;
            auVar89._12_4_ = auVar111._12_4_;
            in_XMM13 = auVar41 & auVar57 | auVar89;
            auVar40 = packssdw(auVar111,in_XMM13);
            auVar40 = packssdw(auVar40 ^ in_XMM14,auVar40 ^ in_XMM14);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              acStack_1200[uVar12 + 0xe] = cVar1 + 'o';
            }
            auVar47 = pshufhw(auVar57,auVar57,0x84);
            auVar40 = pshufhw(auVar41,auVar41,0x84);
            auVar48 = pshufhw(auVar47,auVar89,0x84);
            auVar40 = packssdw(auVar40 & auVar47,(auVar48 | auVar40 & auVar47) ^ in_XMM14);
            auVar40 = packsswb(auVar40,auVar40);
            if ((auVar40._14_2_ >> 8 & 1) != 0) {
              acStack_1200[uVar12 + 0xf] = cVar1 + 'p';
            }
            uVar12 = uVar12 + 0x10;
            lVar21 = auVar42._8_8_;
            auVar42._0_8_ = auVar42._0_8_ + 0x10;
            auVar42._8_8_ = lVar21 + 0x10;
            lVar21 = auVar58._8_8_;
            auVar58._0_8_ = auVar58._0_8_ + 0x10;
            auVar58._8_8_ = lVar21 + 0x10;
            lVar21 = auVar126._8_8_;
            auVar126._0_8_ = auVar126._0_8_ + 0x10;
            auVar126._8_8_ = lVar21 + 0x10;
            lVar21 = auVar92._8_8_;
            auVar92._0_8_ = auVar92._0_8_ + 0x10;
            auVar92._8_8_ = lVar21 + 0x10;
            lVar21 = auVar28._8_8_;
            auVar28._0_8_ = auVar28._0_8_ + 0x10;
            auVar28._8_8_ = lVar21 + 0x10;
            lVar21 = auVar31._8_8_;
            auVar31._0_8_ = auVar31._0_8_ + 0x10;
            auVar31._8_8_ = lVar21 + 0x10;
            lVar21 = auVar34._8_8_;
            auVar34._0_8_ = auVar34._0_8_ + 0x10;
            auVar34._8_8_ = lVar21 + 0x10;
            lVar21 = auVar37._8_8_;
            auVar37._0_8_ = auVar37._0_8_ + 0x10;
            auVar37._8_8_ = lVar21 + 0x10;
          } while (((int)lVar8 + 0xfU & 0x30) != uVar12);
        }
        acStack_1200[lVar8] = '\0';
        pcStack_1208 = (code *)0x12e965;
        iVar2 = rand_r(__seed);
        lVar8 = (long)iVar2 + ((ulong)(long)iVar2 / 3 & 0xfffffffffffffff8) * -3;
        if (lVar8 != 0) {
          lVar21 = lVar8 + -1;
          auVar17._8_4_ = (int)lVar21;
          auVar17._0_8_ = lVar21;
          auVar17._12_4_ = (int)((ulong)lVar21 >> 0x20);
          uVar12 = 0;
          auVar19 = _DAT_00147390;
          auVar22 = _DAT_00147380;
          auVar24 = _DAT_00147370;
          auVar26 = _DAT_00147360;
          auVar29 = _DAT_00147350;
          auVar32 = _DAT_00147340;
          auVar35 = _DAT_00147330;
          auVar38 = _DAT_00147320;
          do {
            auVar42 = auVar17 ^ _DAT_001473a0;
            auVar58 = auVar19 ^ _DAT_001473a0;
            iVar2 = auVar42._0_4_;
            iVar108 = -(uint)(iVar2 < auVar58._0_4_);
            iVar107 = auVar42._4_4_;
            auVar60._4_4_ = -(uint)(iVar107 < auVar58._4_4_);
            iVar45 = auVar42._8_4_;
            iVar120 = -(uint)(iVar45 < auVar58._8_4_);
            iVar46 = auVar42._12_4_;
            auVar60._12_4_ = -(uint)(iVar46 < auVar58._12_4_);
            auVar90._4_4_ = iVar108;
            auVar90._0_4_ = iVar108;
            auVar90._8_4_ = iVar120;
            auVar90._12_4_ = iVar120;
            auVar42 = pshuflw(in_XMM13,auVar90,0xe8);
            auVar59._4_4_ = -(uint)(auVar58._4_4_ == iVar107);
            auVar59._12_4_ = -(uint)(auVar58._12_4_ == iVar46);
            auVar59._0_4_ = auVar59._4_4_;
            auVar59._8_4_ = auVar59._12_4_;
            auVar126 = pshuflw(in_XMM14,auVar59,0xe8);
            auVar60._0_4_ = auVar60._4_4_;
            auVar60._8_4_ = auVar60._12_4_;
            auVar58 = pshuflw(auVar42,auVar60,0xe8);
            auVar127._8_4_ = 0xffffffff;
            auVar127._0_8_ = 0xffffffffffffffff;
            auVar127._12_4_ = 0xffffffff;
            auVar42 = (auVar58 | auVar126 & auVar42) ^ auVar127;
            auVar42 = packssdw(auVar42,auVar42);
            cVar1 = (char)uVar12;
            if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              acStack_11e0[uVar12] = cVar1 + 'a';
            }
            auVar60 = auVar59 & auVar90 | auVar60;
            auVar42 = packssdw(auVar60,auVar60);
            auVar42 = packssdw(auVar42 ^ auVar127,auVar42 ^ auVar127);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42._0_4_ >> 8 & 1) != 0) {
              acStack_11e0[uVar12 + 1] = cVar1 + 'b';
            }
            auVar42 = auVar22 ^ _DAT_001473a0;
            iVar108 = -(uint)(iVar2 < auVar42._0_4_);
            auVar112._4_4_ = -(uint)(iVar107 < auVar42._4_4_);
            iVar120 = -(uint)(iVar45 < auVar42._8_4_);
            auVar112._12_4_ = -(uint)(iVar46 < auVar42._12_4_);
            auVar61._4_4_ = iVar108;
            auVar61._0_4_ = iVar108;
            auVar61._8_4_ = iVar120;
            auVar61._12_4_ = iVar120;
            auVar91._4_4_ = -(uint)(auVar42._4_4_ == iVar107);
            auVar91._12_4_ = -(uint)(auVar42._12_4_ == iVar46);
            auVar91._0_4_ = auVar91._4_4_;
            auVar91._8_4_ = auVar91._12_4_;
            auVar112._0_4_ = auVar112._4_4_;
            auVar112._8_4_ = auVar112._12_4_;
            auVar42 = auVar91 & auVar61 | auVar112;
            auVar42 = packssdw(auVar42,auVar42);
            auVar42 = packssdw(auVar42 ^ auVar127,auVar42 ^ auVar127);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42._0_4_ >> 0x10 & 1) != 0) {
              acStack_11e0[uVar12 + 2] = cVar1 + 'c';
            }
            auVar58 = pshufhw(auVar61,auVar61,0x84);
            auVar92 = pshufhw(auVar91,auVar91,0x84);
            auVar126 = pshufhw(auVar58,auVar112,0x84);
            auVar58 = (auVar126 | auVar92 & auVar58) ^ auVar127;
            auVar58 = packssdw(auVar58,auVar58);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._0_4_ >> 0x18 & 1) != 0) {
              acStack_11e0[uVar12 + 3] = cVar1 + 'd';
            }
            auVar58 = auVar24 ^ _DAT_001473a0;
            iVar108 = -(uint)(iVar2 < auVar58._0_4_);
            auVar63._4_4_ = -(uint)(iVar107 < auVar58._4_4_);
            iVar120 = -(uint)(iVar45 < auVar58._8_4_);
            auVar63._12_4_ = -(uint)(iVar46 < auVar58._12_4_);
            auVar93._4_4_ = iVar108;
            auVar93._0_4_ = iVar108;
            auVar93._8_4_ = iVar120;
            auVar93._12_4_ = iVar120;
            auVar42 = pshuflw(auVar42,auVar93,0xe8);
            auVar62._4_4_ = -(uint)(auVar58._4_4_ == iVar107);
            auVar62._12_4_ = -(uint)(auVar58._12_4_ == iVar46);
            auVar62._0_4_ = auVar62._4_4_;
            auVar62._8_4_ = auVar62._12_4_;
            auVar126 = pshuflw(auVar127,auVar62,0xe8);
            auVar63._0_4_ = auVar63._4_4_;
            auVar63._8_4_ = auVar63._12_4_;
            auVar58 = pshuflw(auVar42,auVar63,0xe8);
            auVar128._8_4_ = 0xffffffff;
            auVar128._0_8_ = 0xffffffffffffffff;
            auVar128._12_4_ = 0xffffffff;
            auVar42 = (auVar58 | auVar126 & auVar42) ^ auVar128;
            auVar42 = packssdw(auVar42,auVar42);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              acStack_11e0[uVar12 + 4] = cVar1 + 'e';
            }
            auVar63 = auVar62 & auVar93 | auVar63;
            auVar42 = packssdw(auVar63,auVar63);
            auVar42 = packssdw(auVar42 ^ auVar128,auVar42 ^ auVar128);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42._4_2_ >> 8 & 1) != 0) {
              acStack_11e0[uVar12 + 5] = cVar1 + 'f';
            }
            auVar42 = auVar26 ^ _DAT_001473a0;
            iVar108 = -(uint)(iVar2 < auVar42._0_4_);
            auVar113._4_4_ = -(uint)(iVar107 < auVar42._4_4_);
            iVar120 = -(uint)(iVar45 < auVar42._8_4_);
            auVar113._12_4_ = -(uint)(iVar46 < auVar42._12_4_);
            auVar64._4_4_ = iVar108;
            auVar64._0_4_ = iVar108;
            auVar64._8_4_ = iVar120;
            auVar64._12_4_ = iVar120;
            auVar94._4_4_ = -(uint)(auVar42._4_4_ == iVar107);
            auVar94._12_4_ = -(uint)(auVar42._12_4_ == iVar46);
            auVar94._0_4_ = auVar94._4_4_;
            auVar94._8_4_ = auVar94._12_4_;
            auVar113._0_4_ = auVar113._4_4_;
            auVar113._8_4_ = auVar113._12_4_;
            auVar42 = auVar94 & auVar64 | auVar113;
            auVar42 = packssdw(auVar42,auVar42);
            auVar42 = packssdw(auVar42 ^ auVar128,auVar42 ^ auVar128);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              acStack_11e0[uVar12 + 6] = cVar1 + 'g';
            }
            auVar58 = pshufhw(auVar64,auVar64,0x84);
            auVar92 = pshufhw(auVar94,auVar94,0x84);
            auVar126 = pshufhw(auVar58,auVar113,0x84);
            auVar58 = (auVar126 | auVar92 & auVar58) ^ auVar128;
            auVar58 = packssdw(auVar58,auVar58);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._6_2_ >> 8 & 1) != 0) {
              acStack_11e0[uVar12 + 7] = cVar1 + 'h';
            }
            auVar58 = auVar29 ^ _DAT_001473a0;
            iVar108 = -(uint)(iVar2 < auVar58._0_4_);
            auVar66._4_4_ = -(uint)(iVar107 < auVar58._4_4_);
            iVar120 = -(uint)(iVar45 < auVar58._8_4_);
            auVar66._12_4_ = -(uint)(iVar46 < auVar58._12_4_);
            auVar95._4_4_ = iVar108;
            auVar95._0_4_ = iVar108;
            auVar95._8_4_ = iVar120;
            auVar95._12_4_ = iVar120;
            auVar42 = pshuflw(auVar42,auVar95,0xe8);
            auVar65._4_4_ = -(uint)(auVar58._4_4_ == iVar107);
            auVar65._12_4_ = -(uint)(auVar58._12_4_ == iVar46);
            auVar65._0_4_ = auVar65._4_4_;
            auVar65._8_4_ = auVar65._12_4_;
            auVar126 = pshuflw(auVar128,auVar65,0xe8);
            auVar66._0_4_ = auVar66._4_4_;
            auVar66._8_4_ = auVar66._12_4_;
            auVar58 = pshuflw(auVar42,auVar66,0xe8);
            auVar129._8_4_ = 0xffffffff;
            auVar129._0_8_ = 0xffffffffffffffff;
            auVar129._12_4_ = 0xffffffff;
            auVar42 = (auVar58 | auVar126 & auVar42) ^ auVar129;
            auVar42 = packssdw(auVar42,auVar42);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              acStack_11e0[uVar12 + 8] = cVar1 + 'i';
            }
            auVar66 = auVar65 & auVar95 | auVar66;
            auVar42 = packssdw(auVar66,auVar66);
            auVar42 = packssdw(auVar42 ^ auVar129,auVar42 ^ auVar129);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42._8_2_ >> 8 & 1) != 0) {
              acStack_11e0[uVar12 + 9] = cVar1 + 'j';
            }
            auVar42 = auVar32 ^ _DAT_001473a0;
            iVar108 = -(uint)(iVar2 < auVar42._0_4_);
            auVar114._4_4_ = -(uint)(iVar107 < auVar42._4_4_);
            iVar120 = -(uint)(iVar45 < auVar42._8_4_);
            auVar114._12_4_ = -(uint)(iVar46 < auVar42._12_4_);
            auVar67._4_4_ = iVar108;
            auVar67._0_4_ = iVar108;
            auVar67._8_4_ = iVar120;
            auVar67._12_4_ = iVar120;
            auVar96._4_4_ = -(uint)(auVar42._4_4_ == iVar107);
            auVar96._12_4_ = -(uint)(auVar42._12_4_ == iVar46);
            auVar96._0_4_ = auVar96._4_4_;
            auVar96._8_4_ = auVar96._12_4_;
            auVar114._0_4_ = auVar114._4_4_;
            auVar114._8_4_ = auVar114._12_4_;
            auVar42 = auVar96 & auVar67 | auVar114;
            auVar42 = packssdw(auVar42,auVar42);
            auVar42 = packssdw(auVar42 ^ auVar129,auVar42 ^ auVar129);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              acStack_11e0[uVar12 + 10] = cVar1 + 'k';
            }
            auVar58 = pshufhw(auVar67,auVar67,0x84);
            auVar92 = pshufhw(auVar96,auVar96,0x84);
            auVar126 = pshufhw(auVar58,auVar114,0x84);
            auVar58 = (auVar126 | auVar92 & auVar58) ^ auVar129;
            auVar58 = packssdw(auVar58,auVar58);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._10_2_ >> 8 & 1) != 0) {
              acStack_11e0[uVar12 + 0xb] = cVar1 + 'l';
            }
            auVar58 = auVar35 ^ _DAT_001473a0;
            iVar108 = -(uint)(iVar2 < auVar58._0_4_);
            auVar69._4_4_ = -(uint)(iVar107 < auVar58._4_4_);
            iVar120 = -(uint)(iVar45 < auVar58._8_4_);
            auVar69._12_4_ = -(uint)(iVar46 < auVar58._12_4_);
            auVar97._4_4_ = iVar108;
            auVar97._0_4_ = iVar108;
            auVar97._8_4_ = iVar120;
            auVar97._12_4_ = iVar120;
            auVar42 = pshuflw(auVar42,auVar97,0xe8);
            auVar68._4_4_ = -(uint)(auVar58._4_4_ == iVar107);
            auVar68._12_4_ = -(uint)(auVar58._12_4_ == iVar46);
            auVar68._0_4_ = auVar68._4_4_;
            auVar68._8_4_ = auVar68._12_4_;
            auVar126 = pshuflw(auVar129,auVar68,0xe8);
            auVar69._0_4_ = auVar69._4_4_;
            auVar69._8_4_ = auVar69._12_4_;
            auVar58 = pshuflw(auVar42,auVar69,0xe8);
            in_XMM14._8_4_ = 0xffffffff;
            in_XMM14._0_8_ = 0xffffffffffffffff;
            in_XMM14._12_4_ = 0xffffffff;
            auVar42 = (auVar58 | auVar126 & auVar42) ^ in_XMM14;
            auVar42 = packssdw(auVar42,auVar42);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              acStack_11e0[uVar12 + 0xc] = cVar1 + 'm';
            }
            auVar69 = auVar68 & auVar97 | auVar69;
            auVar42 = packssdw(auVar69,auVar69);
            auVar42 = packssdw(auVar42 ^ in_XMM14,auVar42 ^ in_XMM14);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42._12_2_ >> 8 & 1) != 0) {
              acStack_11e0[uVar12 + 0xd] = cVar1 + 'n';
            }
            auVar42 = auVar38 ^ _DAT_001473a0;
            auVar115._0_4_ = -(uint)(iVar2 < auVar42._0_4_);
            auVar115._4_4_ = -(uint)(iVar107 < auVar42._4_4_);
            auVar115._8_4_ = -(uint)(iVar45 < auVar42._8_4_);
            auVar115._12_4_ = -(uint)(iVar46 < auVar42._12_4_);
            auVar70._4_4_ = auVar115._0_4_;
            auVar70._0_4_ = auVar115._0_4_;
            auVar70._8_4_ = auVar115._8_4_;
            auVar70._12_4_ = auVar115._8_4_;
            iVar2 = -(uint)(auVar42._4_4_ == iVar107);
            iVar107 = -(uint)(auVar42._12_4_ == iVar46);
            auVar43._4_4_ = iVar2;
            auVar43._0_4_ = iVar2;
            auVar43._8_4_ = iVar107;
            auVar43._12_4_ = iVar107;
            auVar98._4_4_ = auVar115._4_4_;
            auVar98._0_4_ = auVar115._4_4_;
            auVar98._8_4_ = auVar115._12_4_;
            auVar98._12_4_ = auVar115._12_4_;
            in_XMM13 = auVar43 & auVar70 | auVar98;
            auVar42 = packssdw(auVar115,in_XMM13);
            auVar42 = packssdw(auVar42 ^ in_XMM14,auVar42 ^ in_XMM14);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              acStack_11e0[uVar12 + 0xe] = cVar1 + 'o';
            }
            auVar58 = pshufhw(auVar70,auVar70,0x84);
            auVar42 = pshufhw(auVar43,auVar43,0x84);
            auVar126 = pshufhw(auVar58,auVar98,0x84);
            auVar42 = packssdw(auVar42 & auVar58,(auVar126 | auVar42 & auVar58) ^ in_XMM14);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42._14_2_ >> 8 & 1) != 0) {
              acStack_11e0[uVar12 + 0xf] = cVar1 + 'p';
            }
            uVar12 = uVar12 + 0x10;
            lVar21 = auVar19._8_8_;
            auVar19._0_8_ = auVar19._0_8_ + 0x10;
            auVar19._8_8_ = lVar21 + 0x10;
            lVar21 = auVar22._8_8_;
            auVar22._0_8_ = auVar22._0_8_ + 0x10;
            auVar22._8_8_ = lVar21 + 0x10;
            lVar21 = auVar24._8_8_;
            auVar24._0_8_ = auVar24._0_8_ + 0x10;
            auVar24._8_8_ = lVar21 + 0x10;
            lVar21 = auVar26._8_8_;
            auVar26._0_8_ = auVar26._0_8_ + 0x10;
            auVar26._8_8_ = lVar21 + 0x10;
            lVar21 = auVar29._8_8_;
            auVar29._0_8_ = auVar29._0_8_ + 0x10;
            auVar29._8_8_ = lVar21 + 0x10;
            lVar21 = auVar32._8_8_;
            auVar32._0_8_ = auVar32._0_8_ + 0x10;
            auVar32._8_8_ = lVar21 + 0x10;
            lVar21 = auVar35._8_8_;
            auVar35._0_8_ = auVar35._0_8_ + 0x10;
            auVar35._8_8_ = lVar21 + 0x10;
            lVar21 = auVar38._8_8_;
            auVar38._0_8_ = auVar38._0_8_ + 0x10;
            auVar38._8_8_ = lVar21 + 0x10;
          } while (((int)lVar8 + 0xfU & 0x30) != uVar12);
        }
        acStack_11e0[lVar8] = '\0';
        pcStack_1208 = (code *)0x12ef6e;
        bson_append_utf8(uVar9,acStack_1200,0xffffffff,acStack_11e0,0xffffffff);
        uVar9 = *(undefined8 *)(__n + (long)pcVar13 * 8);
        pcStack_1208 = (code *)0x12ef7a;
        iVar2 = rand_r(__seed);
        lVar8 = (long)iVar2 + ((ulong)(long)iVar2 / 3 & 0xfffffffffffffff8) * -3;
        if (lVar8 != 0) {
          lVar21 = lVar8 + -1;
          auVar18._8_4_ = (int)lVar21;
          auVar18._0_8_ = lVar21;
          auVar18._12_4_ = (int)((ulong)lVar21 >> 0x20);
          uVar12 = 0;
          auVar20 = _DAT_00147390;
          auVar23 = _DAT_00147380;
          auVar25 = _DAT_00147370;
          auVar27 = _DAT_00147360;
          auVar30 = _DAT_00147350;
          auVar33 = _DAT_00147340;
          auVar36 = _DAT_00147330;
          auVar39 = _DAT_00147320;
          do {
            auVar42 = auVar18 ^ _DAT_001473a0;
            auVar58 = auVar20 ^ _DAT_001473a0;
            iVar2 = auVar42._0_4_;
            iVar108 = -(uint)(iVar2 < auVar58._0_4_);
            iVar107 = auVar42._4_4_;
            auVar72._4_4_ = -(uint)(iVar107 < auVar58._4_4_);
            iVar45 = auVar42._8_4_;
            iVar120 = -(uint)(iVar45 < auVar58._8_4_);
            iVar46 = auVar42._12_4_;
            auVar72._12_4_ = -(uint)(iVar46 < auVar58._12_4_);
            auVar99._4_4_ = iVar108;
            auVar99._0_4_ = iVar108;
            auVar99._8_4_ = iVar120;
            auVar99._12_4_ = iVar120;
            auVar42 = pshuflw(in_XMM13,auVar99,0xe8);
            auVar71._4_4_ = -(uint)(auVar58._4_4_ == iVar107);
            auVar71._12_4_ = -(uint)(auVar58._12_4_ == iVar46);
            auVar71._0_4_ = auVar71._4_4_;
            auVar71._8_4_ = auVar71._12_4_;
            auVar126 = pshuflw(in_XMM14,auVar71,0xe8);
            auVar72._0_4_ = auVar72._4_4_;
            auVar72._8_4_ = auVar72._12_4_;
            auVar58 = pshuflw(auVar42,auVar72,0xe8);
            auVar130._8_4_ = 0xffffffff;
            auVar130._0_8_ = 0xffffffffffffffff;
            auVar130._12_4_ = 0xffffffff;
            auVar42 = (auVar58 | auVar126 & auVar42) ^ auVar130;
            auVar42 = packssdw(auVar42,auVar42);
            cVar1 = (char)uVar12;
            if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              acStack_1200[uVar12] = cVar1 + 'a';
            }
            auVar72 = auVar71 & auVar99 | auVar72;
            auVar42 = packssdw(auVar72,auVar72);
            auVar42 = packssdw(auVar42 ^ auVar130,auVar42 ^ auVar130);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42._0_4_ >> 8 & 1) != 0) {
              acStack_1200[uVar12 + 1] = cVar1 + 'b';
            }
            auVar42 = auVar23 ^ _DAT_001473a0;
            iVar108 = -(uint)(iVar2 < auVar42._0_4_);
            auVar116._4_4_ = -(uint)(iVar107 < auVar42._4_4_);
            iVar120 = -(uint)(iVar45 < auVar42._8_4_);
            auVar116._12_4_ = -(uint)(iVar46 < auVar42._12_4_);
            auVar73._4_4_ = iVar108;
            auVar73._0_4_ = iVar108;
            auVar73._8_4_ = iVar120;
            auVar73._12_4_ = iVar120;
            auVar100._4_4_ = -(uint)(auVar42._4_4_ == iVar107);
            auVar100._12_4_ = -(uint)(auVar42._12_4_ == iVar46);
            auVar100._0_4_ = auVar100._4_4_;
            auVar100._8_4_ = auVar100._12_4_;
            auVar116._0_4_ = auVar116._4_4_;
            auVar116._8_4_ = auVar116._12_4_;
            auVar42 = auVar100 & auVar73 | auVar116;
            auVar42 = packssdw(auVar42,auVar42);
            auVar42 = packssdw(auVar42 ^ auVar130,auVar42 ^ auVar130);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42._0_4_ >> 0x10 & 1) != 0) {
              acStack_1200[uVar12 + 2] = cVar1 + 'c';
            }
            auVar58 = pshufhw(auVar73,auVar73,0x84);
            auVar92 = pshufhw(auVar100,auVar100,0x84);
            auVar126 = pshufhw(auVar58,auVar116,0x84);
            auVar58 = (auVar126 | auVar92 & auVar58) ^ auVar130;
            auVar58 = packssdw(auVar58,auVar58);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._0_4_ >> 0x18 & 1) != 0) {
              acStack_1200[uVar12 + 3] = cVar1 + 'd';
            }
            auVar58 = auVar25 ^ _DAT_001473a0;
            iVar108 = -(uint)(iVar2 < auVar58._0_4_);
            auVar75._4_4_ = -(uint)(iVar107 < auVar58._4_4_);
            iVar120 = -(uint)(iVar45 < auVar58._8_4_);
            auVar75._12_4_ = -(uint)(iVar46 < auVar58._12_4_);
            auVar101._4_4_ = iVar108;
            auVar101._0_4_ = iVar108;
            auVar101._8_4_ = iVar120;
            auVar101._12_4_ = iVar120;
            auVar42 = pshuflw(auVar42,auVar101,0xe8);
            auVar74._4_4_ = -(uint)(auVar58._4_4_ == iVar107);
            auVar74._12_4_ = -(uint)(auVar58._12_4_ == iVar46);
            auVar74._0_4_ = auVar74._4_4_;
            auVar74._8_4_ = auVar74._12_4_;
            auVar126 = pshuflw(auVar130,auVar74,0xe8);
            auVar75._0_4_ = auVar75._4_4_;
            auVar75._8_4_ = auVar75._12_4_;
            auVar58 = pshuflw(auVar42,auVar75,0xe8);
            auVar131._8_4_ = 0xffffffff;
            auVar131._0_8_ = 0xffffffffffffffff;
            auVar131._12_4_ = 0xffffffff;
            auVar42 = (auVar58 | auVar126 & auVar42) ^ auVar131;
            auVar42 = packssdw(auVar42,auVar42);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              acStack_1200[uVar12 + 4] = cVar1 + 'e';
            }
            auVar75 = auVar74 & auVar101 | auVar75;
            auVar42 = packssdw(auVar75,auVar75);
            auVar42 = packssdw(auVar42 ^ auVar131,auVar42 ^ auVar131);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42._4_2_ >> 8 & 1) != 0) {
              acStack_1200[uVar12 + 5] = cVar1 + 'f';
            }
            auVar42 = auVar27 ^ _DAT_001473a0;
            iVar108 = -(uint)(iVar2 < auVar42._0_4_);
            auVar117._4_4_ = -(uint)(iVar107 < auVar42._4_4_);
            iVar120 = -(uint)(iVar45 < auVar42._8_4_);
            auVar117._12_4_ = -(uint)(iVar46 < auVar42._12_4_);
            auVar76._4_4_ = iVar108;
            auVar76._0_4_ = iVar108;
            auVar76._8_4_ = iVar120;
            auVar76._12_4_ = iVar120;
            auVar102._4_4_ = -(uint)(auVar42._4_4_ == iVar107);
            auVar102._12_4_ = -(uint)(auVar42._12_4_ == iVar46);
            auVar102._0_4_ = auVar102._4_4_;
            auVar102._8_4_ = auVar102._12_4_;
            auVar117._0_4_ = auVar117._4_4_;
            auVar117._8_4_ = auVar117._12_4_;
            auVar42 = auVar102 & auVar76 | auVar117;
            auVar42 = packssdw(auVar42,auVar42);
            auVar42 = packssdw(auVar42 ^ auVar131,auVar42 ^ auVar131);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              acStack_1200[uVar12 + 6] = cVar1 + 'g';
            }
            auVar58 = pshufhw(auVar76,auVar76,0x84);
            auVar92 = pshufhw(auVar102,auVar102,0x84);
            auVar126 = pshufhw(auVar58,auVar117,0x84);
            auVar58 = (auVar126 | auVar92 & auVar58) ^ auVar131;
            auVar58 = packssdw(auVar58,auVar58);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._6_2_ >> 8 & 1) != 0) {
              acStack_1200[uVar12 + 7] = cVar1 + 'h';
            }
            auVar58 = auVar30 ^ _DAT_001473a0;
            iVar108 = -(uint)(iVar2 < auVar58._0_4_);
            auVar78._4_4_ = -(uint)(iVar107 < auVar58._4_4_);
            iVar120 = -(uint)(iVar45 < auVar58._8_4_);
            auVar78._12_4_ = -(uint)(iVar46 < auVar58._12_4_);
            auVar103._4_4_ = iVar108;
            auVar103._0_4_ = iVar108;
            auVar103._8_4_ = iVar120;
            auVar103._12_4_ = iVar120;
            auVar42 = pshuflw(auVar42,auVar103,0xe8);
            auVar77._4_4_ = -(uint)(auVar58._4_4_ == iVar107);
            auVar77._12_4_ = -(uint)(auVar58._12_4_ == iVar46);
            auVar77._0_4_ = auVar77._4_4_;
            auVar77._8_4_ = auVar77._12_4_;
            auVar126 = pshuflw(auVar131,auVar77,0xe8);
            auVar78._0_4_ = auVar78._4_4_;
            auVar78._8_4_ = auVar78._12_4_;
            auVar58 = pshuflw(auVar42,auVar78,0xe8);
            auVar132._8_4_ = 0xffffffff;
            auVar132._0_8_ = 0xffffffffffffffff;
            auVar132._12_4_ = 0xffffffff;
            auVar42 = (auVar58 | auVar126 & auVar42) ^ auVar132;
            auVar42 = packssdw(auVar42,auVar42);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              acStack_1200[uVar12 + 8] = cVar1 + 'i';
            }
            auVar78 = auVar77 & auVar103 | auVar78;
            auVar42 = packssdw(auVar78,auVar78);
            auVar42 = packssdw(auVar42 ^ auVar132,auVar42 ^ auVar132);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42._8_2_ >> 8 & 1) != 0) {
              acStack_1200[uVar12 + 9] = cVar1 + 'j';
            }
            auVar42 = auVar33 ^ _DAT_001473a0;
            iVar108 = -(uint)(iVar2 < auVar42._0_4_);
            auVar118._4_4_ = -(uint)(iVar107 < auVar42._4_4_);
            iVar120 = -(uint)(iVar45 < auVar42._8_4_);
            auVar118._12_4_ = -(uint)(iVar46 < auVar42._12_4_);
            auVar79._4_4_ = iVar108;
            auVar79._0_4_ = iVar108;
            auVar79._8_4_ = iVar120;
            auVar79._12_4_ = iVar120;
            auVar104._4_4_ = -(uint)(auVar42._4_4_ == iVar107);
            auVar104._12_4_ = -(uint)(auVar42._12_4_ == iVar46);
            auVar104._0_4_ = auVar104._4_4_;
            auVar104._8_4_ = auVar104._12_4_;
            auVar118._0_4_ = auVar118._4_4_;
            auVar118._8_4_ = auVar118._12_4_;
            auVar42 = auVar104 & auVar79 | auVar118;
            auVar42 = packssdw(auVar42,auVar42);
            auVar42 = packssdw(auVar42 ^ auVar132,auVar42 ^ auVar132);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              acStack_1200[uVar12 + 10] = cVar1 + 'k';
            }
            auVar58 = pshufhw(auVar79,auVar79,0x84);
            auVar92 = pshufhw(auVar104,auVar104,0x84);
            auVar126 = pshufhw(auVar58,auVar118,0x84);
            auVar58 = (auVar126 | auVar92 & auVar58) ^ auVar132;
            auVar58 = packssdw(auVar58,auVar58);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._10_2_ >> 8 & 1) != 0) {
              acStack_1200[uVar12 + 0xb] = cVar1 + 'l';
            }
            auVar58 = auVar36 ^ _DAT_001473a0;
            iVar108 = -(uint)(iVar2 < auVar58._0_4_);
            auVar81._4_4_ = -(uint)(iVar107 < auVar58._4_4_);
            iVar120 = -(uint)(iVar45 < auVar58._8_4_);
            auVar81._12_4_ = -(uint)(iVar46 < auVar58._12_4_);
            auVar105._4_4_ = iVar108;
            auVar105._0_4_ = iVar108;
            auVar105._8_4_ = iVar120;
            auVar105._12_4_ = iVar120;
            auVar42 = pshuflw(auVar42,auVar105,0xe8);
            auVar80._4_4_ = -(uint)(auVar58._4_4_ == iVar107);
            auVar80._12_4_ = -(uint)(auVar58._12_4_ == iVar46);
            auVar80._0_4_ = auVar80._4_4_;
            auVar80._8_4_ = auVar80._12_4_;
            auVar126 = pshuflw(auVar132,auVar80,0xe8);
            auVar81._0_4_ = auVar81._4_4_;
            auVar81._8_4_ = auVar81._12_4_;
            auVar58 = pshuflw(auVar42,auVar81,0xe8);
            in_XMM14._8_4_ = 0xffffffff;
            in_XMM14._0_8_ = 0xffffffffffffffff;
            in_XMM14._12_4_ = 0xffffffff;
            auVar42 = (auVar58 | auVar126 & auVar42) ^ in_XMM14;
            auVar42 = packssdw(auVar42,auVar42);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              acStack_1200[uVar12 + 0xc] = cVar1 + 'm';
            }
            auVar81 = auVar80 & auVar105 | auVar81;
            auVar42 = packssdw(auVar81,auVar81);
            auVar42 = packssdw(auVar42 ^ in_XMM14,auVar42 ^ in_XMM14);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42._12_2_ >> 8 & 1) != 0) {
              acStack_1200[uVar12 + 0xd] = cVar1 + 'n';
            }
            auVar42 = auVar39 ^ _DAT_001473a0;
            auVar119._0_4_ = -(uint)(iVar2 < auVar42._0_4_);
            auVar119._4_4_ = -(uint)(iVar107 < auVar42._4_4_);
            auVar119._8_4_ = -(uint)(iVar45 < auVar42._8_4_);
            auVar119._12_4_ = -(uint)(iVar46 < auVar42._12_4_);
            auVar82._4_4_ = auVar119._0_4_;
            auVar82._0_4_ = auVar119._0_4_;
            auVar82._8_4_ = auVar119._8_4_;
            auVar82._12_4_ = auVar119._8_4_;
            iVar2 = -(uint)(auVar42._4_4_ == iVar107);
            iVar107 = -(uint)(auVar42._12_4_ == iVar46);
            auVar44._4_4_ = iVar2;
            auVar44._0_4_ = iVar2;
            auVar44._8_4_ = iVar107;
            auVar44._12_4_ = iVar107;
            auVar106._4_4_ = auVar119._4_4_;
            auVar106._0_4_ = auVar119._4_4_;
            auVar106._8_4_ = auVar119._12_4_;
            auVar106._12_4_ = auVar119._12_4_;
            in_XMM13 = auVar44 & auVar82 | auVar106;
            auVar42 = packssdw(auVar119,in_XMM13);
            auVar42 = packssdw(auVar42 ^ in_XMM14,auVar42 ^ in_XMM14);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              acStack_1200[uVar12 + 0xe] = cVar1 + 'o';
            }
            auVar58 = pshufhw(auVar82,auVar82,0x84);
            auVar42 = pshufhw(auVar44,auVar44,0x84);
            auVar126 = pshufhw(auVar58,auVar106,0x84);
            auVar42 = packssdw(auVar42 & auVar58,(auVar126 | auVar42 & auVar58) ^ in_XMM14);
            auVar42 = packsswb(auVar42,auVar42);
            if ((auVar42._14_2_ >> 8 & 1) != 0) {
              acStack_1200[uVar12 + 0xf] = cVar1 + 'p';
            }
            uVar12 = uVar12 + 0x10;
            lVar21 = auVar20._8_8_;
            auVar20._0_8_ = auVar20._0_8_ + 0x10;
            auVar20._8_8_ = lVar21 + 0x10;
            lVar21 = auVar23._8_8_;
            auVar23._0_8_ = auVar23._0_8_ + 0x10;
            auVar23._8_8_ = lVar21 + 0x10;
            lVar21 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 0x10;
            auVar25._8_8_ = lVar21 + 0x10;
            lVar21 = auVar27._8_8_;
            auVar27._0_8_ = auVar27._0_8_ + 0x10;
            auVar27._8_8_ = lVar21 + 0x10;
            lVar21 = auVar30._8_8_;
            auVar30._0_8_ = auVar30._0_8_ + 0x10;
            auVar30._8_8_ = lVar21 + 0x10;
            lVar21 = auVar33._8_8_;
            auVar33._0_8_ = auVar33._0_8_ + 0x10;
            auVar33._8_8_ = lVar21 + 0x10;
            lVar21 = auVar36._8_8_;
            auVar36._0_8_ = auVar36._0_8_ + 0x10;
            auVar36._8_8_ = lVar21 + 0x10;
            lVar21 = auVar39._8_8_;
            auVar39._0_8_ = auVar39._0_8_ + 0x10;
            auVar39._8_8_ = lVar21 + 0x10;
          } while (((int)lVar8 + 0xfU & 0x30) != uVar12);
        }
        acStack_1200[lVar8] = '\0';
        pcStack_1208 = (code *)0x12f56e;
        iVar2 = rand_r(__seed);
        pcStack_1208 = (code *)0x12f59e;
        bson_append_int32(uVar9,acStack_1200,0xffffffff,
                          iVar2 + ((int)((long)iVar2 * 0x40000001 >> 0x3d) - (iVar2 >> 0x1f)) *
                                  -0x7fffffff);
        uVar14 = (int)pcVar7 + 1;
        pcVar7 = (char *)(ulong)uVar14;
      } while (uVar14 != (uint)pcStack_11b8);
    }
    pcStack_1208 = (code *)0x12f5b7;
    lVar8 = bson_as_json(*(undefined8 *)(__n + (long)pcVar13 * 8));
    if (lVar8 == 0) goto LAB_0012f791;
    pcStack_1208 = (code *)0x12f5d0;
    bson_string_append(puStack_11c0);
    pcStack_1208 = (code *)0x12f5d8;
    bson_free(lVar8);
    pcVar6 = pcStack_1198;
    pcVar13 = pcVar13 + 1;
  } while (pcVar13 != pcStack_1198);
  pcStack_1208 = (code *)0x12f5f1;
  iVar2 = rand_r(__seed);
  pcStack_1208 = (code *)0x12f61d;
  pcVar13 = (char *)bson_json_data_reader_new(1,(ulong)(long)iVar2 % 100);
  pcStack_1208 = (code *)0x12f633;
  bson_json_data_reader_ingest(pcVar13,*puStack_11c0,*(undefined4 *)(puStack_11c0 + 1));
  pcVar15 = (char *)0x0;
  while( true ) {
    pcVar7 = auStack_1180;
    pcStack_1208 = (code *)0x12f64a;
    pcStack_11b8 = pcVar15;
    bson_reinit(pcVar7);
    pcStack_1208 = (code *)0x12f65d;
    iVar2 = bson_json_reader_read(pcVar13,pcVar7,auStack_10b8);
    if (iVar2 == -1) break;
    if (iVar2 == 0) {
      pcStack_1208 = (code *)0x12f8a6;
      test_bson_json_read_buffering_cold_1();
      goto LAB_0012f8a6;
    }
    pcStack_1208 = (code *)0x12f676;
    pvStack_11a0 = (void *)bson_get_data(pcVar7);
    pcVar7 = pcStack_11b8;
    pcStack_1208 = (code *)0x12f689;
    pvStack_11a8 = (void *)bson_get_data(*(undefined8 *)(__n + (long)pcStack_11b8 * 8));
    if (*(int *)(*(long *)(__n + (long)pcVar7 * 8) + 4) != auStack_1180._4_4_) goto LAB_0012f796;
    pcStack_1208 = (code *)0x12f6a7;
    pvVar4 = (void *)bson_get_data();
    pcStack_1208 = (code *)0x12f6b7;
    __s2 = (void *)bson_get_data(auStack_1180);
    pcStack_1208 = (code *)0x12f6c9;
    iVar2 = bcmp(pvVar4,__s2,(ulong)*(uint *)(*(long *)(__n + (long)pcVar7 * 8) + 4));
    pcVar6 = pcStack_1198;
    if (iVar2 != 0) goto LAB_0012f796;
    pcVar15 = pcVar7 + 1;
    pcVar7 = auStack_1180;
    if (pcStack_1198 == pcVar15) goto code_r0x0012f6ed;
  }
  pcStack_1208 = (code *)0x12f791;
  test_bson_json_read_buffering_cold_2();
LAB_0012f791:
  pcStack_1208 = (code *)0x12f796;
  test_bson_json_read_buffering_cold_9();
LAB_0012f796:
  __seed = (uint *)auStack_1180;
  pcStack_1208 = (code *)0x12f7a8;
  pcVar6 = (char *)bson_as_canonical_extended_json(__seed);
  pcStack_1208 = (code *)0x12f7b6;
  uVar9 = bson_as_canonical_extended_json(*(undefined8 *)(__n + (long)pcVar7 * 8));
  uVar14 = *(uint *)(*(long *)(__n + (long)pcVar7 * 8) + 4);
  if (auStack_1180._4_4_ == 0) goto LAB_0012f7eb;
  uVar12 = 0;
  goto LAB_0012f7d2;
  while( true ) {
    if (*(char *)((long)pvStack_11a0 + uVar12) != *(char *)((long)pvStack_11a8 + uVar12))
    goto LAB_0012f89a;
    uVar12 = uVar12 + 1;
    if (auStack_1180._4_4_ == (uint)uVar12) break;
LAB_0012f7d2:
    if (uVar14 == (uint)uVar12) break;
  }
LAB_0012f7eb:
  uVar3 = auStack_1180._4_4_;
  if ((uint)auStack_1180._4_4_ < uVar14) {
    uVar3 = uVar14;
  }
  uVar12 = (ulong)(uVar3 - 1);
  while( true ) {
    pcStack_1208 = (code *)0x12f810;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar12,pcVar6,uVar9);
    pcStack_1208 = (code *)0x12f828;
    uVar14 = open("failure.bad.bson",0x42,0x1a0);
    pcVar7 = (char *)(ulong)uVar14;
    pcStack_1208 = (code *)0x12f843;
    uVar3 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar14 == 0xffffffff) break;
    __seed = (uint *)(ulong)uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0012f8ab;
    pcVar6 = (char *)(ulong)(uint)auStack_1180._4_4_;
    pcStack_1208 = (code *)0x12f869;
    pcVar15 = (char *)write(uVar14,pvStack_11a0,(size_t)pcVar6);
    if (pcVar15 != pcVar6) goto LAB_0012f8b0;
    __n = (ulong)*(uint *)(*(long *)(__n + (long)pcStack_11b8 * 8) + 4);
    pcStack_1208 = (code *)0x12f88a;
    uVar12 = write(uVar3,pvStack_11a8,__n);
    if (uVar12 != __n) goto LAB_0012f8b5;
    uVar12 = (ulong)uVar3;
    pcStack_1208 = (code *)0x12f89a;
    test_bson_json_read_buffering_cold_5();
    uVar9 = extraout_RAX;
LAB_0012f89a:
    uVar12 = uVar12 & 0xffffffff;
  }
LAB_0012f8a6:
  pcStack_1208 = (code *)0x12f8ab;
  test_bson_json_read_buffering_cold_7();
LAB_0012f8ab:
  pcStack_1208 = (code *)0x12f8b0;
  test_bson_json_read_buffering_cold_6();
LAB_0012f8b0:
  pcStack_1208 = (code *)0x12f8b5;
  test_bson_json_read_buffering_cold_3();
LAB_0012f8b5:
  pcStack_1208 = (code *)0x12f8ba;
  test_bson_json_read_buffering_cold_4();
  goto LAB_0012f8ba;
code_r0x0012f6ed:
  pcStack_1208 = (code *)0x12f700;
  iVar2 = bson_json_reader_read(pcVar13,pcVar7,auStack_10b8);
  if (iVar2 != 0) {
LAB_0012f8ba:
    pcStack_1208 = test_bson_json_read;
    test_bson_json_read_buffering_cold_8();
    uStack_1230 = __n;
    pcStack_1228 = pcVar6;
    pcStack_1220 = pcVar13;
    pcStack_1218 = pcVar7;
    puStack_1210 = __seed;
    pcStack_1208 = (code *)apcStack_e08;
    bson_oid_init_from_string(auStack_123c,"000000000000000000000000");
    uVar9 = bson_bcon_magic();
    uVar10 = bcon_new(0x405edd2f1a9fbe77,0,"foo","bar","bar",uVar9,0xf,0x3035,"baz",uVar9,1,"map",
                      "{","a",uVar9,0xf,1,"}","array","[",uVar9,0xf,1,uVar9,0xf,2,uVar9,0xf,3,uVar9,
                      0xf,4,"]","null",uVar9,9,"boolean",uVar9,7,1,"oid",uVar9,6,auStack_123c,
                      "binary",uVar9,4,0,"deadbeef",8,"regex",uVar9,10,"foo|bar","ism","date",uVar9,
                      8,10000,"ref","{","$ref",uVar9,0,"foo","$id",uVar9,6,auStack_123c);
    uVar11 = bcon_new(0,"after","b",0);
    iVar2 = 0x149eee;
    uVar9 = bcon_new(0,"twice",uVar9,7,1,0);
    _test_bson_json_read_compare
              ("{ \n      \"foo\" : \"bar\", \n      \"bar\" : 12341, \n      \"baz\" : 123.456, \n      \"map\" : { \"a\" : 1 }, \n      \"array\" : [ 1, 2, 3, 4 ], \n      \"null\" : null, \n      \"boolean\" : true, \n      \"oid\" : { \n        \"$oid\" : \"000000000000000000000000\" \n      }, \n      \"binary\" : { \n        \"$type\" : \"00\", \n        \"$binary\" : \"ZGVhZGJlZWY=\" \n      }, \n      \"regex\" : { \n        \"$regularExpression\" : { \n          \"pattern\": \"foo|bar\", \"options\" : \"ism\" \n        } \n      }, \n      \"date\" : { \n        \"$date\" : \"1970-01-01T00:00:10Z\" \n      }, \n      \"ref\" : { \n        \"$ref\" : \"foo\", \n        \"$id\" : {\"$oid\": \"000000000000000000000000\"} \n      }, \n      \"undefined\" : { \n        \"$undefined\" : true \n      }, \n      \"minkey\" : { \n        \"$minKey\" : 1 \n      }, \n      \"maxkey\" : { \n        \"$maxKey\" : 1 \n      }, \n      \"timestamp\" : { \n        \"$timestamp\" : { \n           \"t\" : 100, \n           \"i\" : 1000 \n        } \n      } \n   } { \"after\": \"b\" } { \"twice\" : true }"
               ,iVar2,uVar10,uVar11,uVar9,0);
    return;
  }
  pcStack_1208 = (code *)0x12f710;
  bson_json_reader_destroy(pcVar13);
  pcStack_1208 = (code *)0x12f71c;
  bson_string_truncate(puStack_11c0);
  pcVar7 = (char *)0x0;
  do {
    pcStack_1208 = (code *)0x12f728;
    bson_destroy(*(undefined8 *)(__n + (long)pcVar7 * 8));
    pcVar7 = pcVar7 + 1;
  } while (pcVar6 != pcVar7);
  pcStack_1208 = (code *)0x12f738;
  bson_free(__n);
  iVar2 = iStack_11ac + 1;
  if (iVar2 == 0x32) goto code_r0x0012f74c;
  goto LAB_0012e319;
code_r0x0012f74c:
  pcVar6 = pcVar6 + 1;
  if (pcVar6 == (char *)0xa) {
    pcStack_1208 = (code *)0x12f768;
    bson_string_free(puStack_11c0,1);
    pcStack_1208 = (code *)0x12f775;
    bson_destroy(auStack_1180);
    return;
  }
  goto LAB_0012e305;
}

Assistant:

static void
test_bson_as_json_stack_overflow (void)
{
   uint8_t *buf;
   bson_t b;
   size_t buflen = 1024 * 1024 * 17;
   char *str;
   int fd;
   ssize_t r;

   buf = bson_malloc0 (buflen);

   fd = bson_open (BINARY_DIR "/stackoverflow.bson", O_RDONLY);
   BSON_ASSERT (-1 != fd);

   r = bson_read (fd, buf, buflen);
   BSON_ASSERT (r == 16777220);

   r = bson_init_static (&b, buf, 16777220);
   BSON_ASSERT (r);

   str = bson_as_json (&b, NULL);
   BSON_ASSERT (str);

   r = !!strstr (str, "...");
   BSON_ASSERT (r);

   bson_free (str);
   bson_destroy (&b);
   bson_free (buf);
}